

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

ssize_t Curl_cf_recv(Curl_easy *data,int num,char *buf,size_t len,CURLcode *code)

{
  bool bVar1;
  ssize_t nread;
  Curl_cfilter *cf;
  CURLcode *code_local;
  size_t len_local;
  char *buf_local;
  int num_local;
  Curl_easy *data_local;
  
  *code = CURLE_OK;
  nread = (ssize_t)data->conn->cfilter[num];
  while( true ) {
    bVar1 = false;
    if (nread != 0) {
      bVar1 = (*(byte *)(nread + 0x24) & 1) == 0;
    }
    if (!bVar1) break;
    nread = *(ssize_t *)(nread + 8);
  }
  if (nread == 0) {
    Curl_failf(data,"recv: no filter connected");
    *code = CURLE_FAILED_INIT;
    data_local = (Curl_easy *)0xffffffffffffffff;
  }
  else {
    data_local = (Curl_easy *)(**(code **)(*(long *)nread + 0x50))(nread,data,buf,len,code);
  }
  return (ssize_t)data_local;
}

Assistant:

ssize_t Curl_cf_recv(struct Curl_easy *data, int num, char *buf,
                     size_t len, CURLcode *code)
{
  struct Curl_cfilter *cf;

  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  *code = CURLE_OK;
  cf = data->conn->cfilter[num];
  while(cf && !cf->connected) {
    cf = cf->next;
  }
  if(cf) {
    ssize_t nread = cf->cft->do_recv(cf, data, buf, len, code);
    DEBUGASSERT(nread >= 0 || *code);
    DEBUGASSERT(nread < 0 || !*code);
    return nread;
  }
  failf(data, "recv: no filter connected");
  *code = CURLE_FAILED_INIT;
  return -1;
}